

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

double xmlXPathStringEvalNumber(xmlChar *str)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  xmlChar *cur;
  xmlChar *pxVar11;
  bool bVar12;
  byte *pbVar13;
  byte *pbVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (str == (xmlChar *)0x0) {
    return 0.0;
  }
  pxVar11 = str + 2;
  do {
    bVar2 = pxVar11[-2];
    uVar4 = (ulong)bVar2;
    if (0x2e < uVar4) {
LAB_001d51d8:
      if (bVar2 != 0x2d && 9 < (byte)(bVar2 - 0x30)) {
        return NAN;
      }
LAB_001d51f0:
      uVar4 = (ulong)(bVar2 == 0x2d);
      dVar16 = 0.0;
      bVar12 = true;
      bVar3 = 0;
      for (; bVar9 = pxVar11[uVar4 - 2], (byte)(bVar9 - 0x30) < 10; pxVar11 = pxVar11 + 1) {
        dVar16 = dVar16 * 10.0 + (double)(bVar9 & 0xf);
        bVar3 = 1;
        bVar12 = false;
      }
      if (bVar9 == 0x2e) {
        bVar9 = pxVar11[uVar4 - 1];
        if (bVar9 < 0x30) {
          if (bVar12) {
            return NAN;
          }
        }
        else if (!(bool)(bVar3 | bVar9 < 0x3a)) {
          return NAN;
        }
        uVar8 = 0;
        while (bVar9 == 0x30) {
          lVar1 = uVar4 + uVar8;
          uVar8 = uVar8 + 1;
          bVar9 = pxVar11[lVar1];
        }
        pbVar5 = pxVar11 + uVar8 + uVar4;
        pbVar14 = pxVar11 + uVar8 + uVar4 + -2;
        pbVar13 = pxVar11 + uVar8 + uVar4 + -1;
        iVar10 = (int)uVar8;
        dVar17 = 0.0;
        while ((uVar6 = (uint)uVar8, (byte)(bVar9 - 0x30) < 10 && (uVar6 < iVar10 + 0x14U))) {
          dVar17 = dVar17 * 10.0 + (double)(int)(bVar9 - 0x30);
          pbVar13 = pbVar13 + 1;
          bVar9 = *pbVar5;
          pbVar14 = pbVar14 + 1;
          pbVar5 = pbVar5 + 1;
          uVar8 = (ulong)(uVar6 + 1);
        }
        dVar15 = pow(10.0,(double)(int)uVar6);
        do {
          bVar9 = *pbVar13;
          pbVar13 = pbVar13 + 1;
          pbVar14 = pbVar14 + 1;
        } while ((byte)(bVar9 - 0x30) < 10);
        dVar16 = dVar16 + dVar17 / dVar15;
      }
      else {
        pbVar14 = pxVar11 + (uVar4 - 2);
      }
      uVar4 = (ulong)bVar9;
      if ((bVar9 | 0x20) == 0x65) {
        bVar12 = true;
        if (pbVar14[1] == 0x2b) {
          pbVar14 = pbVar14 + 2;
        }
        else if (pbVar14[1] == 0x2d) {
          pbVar14 = pbVar14 + 2;
          bVar12 = false;
        }
        else {
          pbVar14 = pbVar14 + 1;
        }
        iVar10 = 0;
        while( true ) {
          bVar3 = *pbVar14;
          uVar4 = (ulong)bVar3;
          if (9 < (byte)(bVar3 - 0x30)) break;
          if (iVar10 < 1000000) {
            iVar10 = iVar10 * 10 + -0x30 + (uint)bVar3;
          }
          pbVar14 = pbVar14 + 1;
        }
      }
      else {
        bVar12 = true;
        iVar10 = 0;
      }
      while( true ) {
        pbVar14 = pbVar14 + 1;
        if (0x20 < (byte)uVar4) {
          return NAN;
        }
        if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) break;
        uVar4 = (ulong)*pbVar14;
      }
      if (uVar4 != 0) {
        return NAN;
      }
      if (bVar2 == 0x2d) {
        dVar16 = -dVar16;
      }
      iVar7 = -iVar10;
      if (bVar12) {
        iVar7 = iVar10;
      }
      dVar17 = pow(10.0,(double)iVar7);
      return dVar17 * dVar16;
    }
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x2e) goto LAB_001d51f0;
      goto LAB_001d51d8;
    }
    pxVar11 = pxVar11 + 1;
  } while( true );
}

Assistant:

double
xmlXPathStringEvalNumber(const xmlChar *str) {
    const xmlChar *cur = str;
    double ret;
    int ok = 0;
    int isneg = 0;
    int exponent = 0;
    int is_exponent_negative = 0;
#ifdef __GNUC__
    unsigned long tmp = 0;
    double temp;
#endif
    if (cur == NULL) return(0);
    while (IS_BLANK_CH(*cur)) cur++;
    if ((*cur != '.') && ((*cur < '0') || (*cur > '9')) && (*cur != '-')) {
        return(NAN);
    }
    if (*cur == '-') {
	isneg = 1;
	cur++;
    }

#ifdef __GNUC__
    /*
     * tmp/temp is a workaround against a gcc compiler bug
     * http://veillard.com/gcc.bug
     */
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10;
	tmp = (*cur - '0');
	ok = 1;
	cur++;
	temp = (double) tmp;
	ret = ret + temp;
    }
#else
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	ok = 1;
	cur++;
    }
#endif

    if (*cur == '.') {
	int v, frac = 0, max;
	double fraction = 0;

        cur++;
	if (((*cur < '0') || (*cur > '9')) && (!ok)) {
	    return(NAN);
	}
        while (*cur == '0') {
	    frac = frac + 1;
	    cur++;
        }
        max = frac + MAX_FRAC;
	while (((*cur >= '0') && (*cur <= '9')) && (frac < max)) {
	    v = (*cur - '0');
	    fraction = fraction * 10 + v;
	    frac = frac + 1;
	    cur++;
	}
	fraction /= pow(10.0, frac);
	ret = ret + fraction;
	while ((*cur >= '0') && (*cur <= '9'))
	    cur++;
    }
    if ((*cur == 'e') || (*cur == 'E')) {
      cur++;
      if (*cur == '-') {
	is_exponent_negative = 1;
	cur++;
      } else if (*cur == '+') {
        cur++;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        if (exponent < 1000000)
	  exponent = exponent * 10 + (*cur - '0');
	cur++;
      }
    }
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur != 0) return(NAN);
    if (isneg) ret = -ret;
    if (is_exponent_negative) exponent = -exponent;
    ret *= pow(10.0, (double)exponent);
    return(ret);
}